

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O3

void lf::io::WriteToFile(VtkFile *vtk_file,string *filename)

{
  pointer pvVar1;
  size_type sVar2;
  bool bVar3;
  buffering_policy bVar4;
  buffering_policy bVar5;
  char cVar6;
  result_type_conflict1 rVar7;
  type attr_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  undefined8 *puVar9;
  pointer pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[5]>_>_>,_0L>
  that_7;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[9]>_>_>,_0L>
  that_57;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[7]>_>_>,_0L>
  that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[8]>_>_>,_0L>
  that;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[12]>_>_>,_0L>
  that_4;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[9]>_>_>,_0L>
  that_15;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[8]>_>_>,_0L>
  that_16;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_8;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_28;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_3;
  ostream_iterator<char,_char,_std::char_traits<char>_> outit;
  VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_false>
  grammar;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[27]>_>_>,_0L>
  that_32;
  ofstream file;
  generator_binder<boost::spirit::karma::action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<32>,_(boost::endian::order)0,_32>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::argument<0>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::static_cast_,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::detail::target<int>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>_>,_2L>_>_>,_mpl_::bool_<false>_>
  f;
  char *local_b68 [2];
  undefined1 local_b58 [16];
  undefined1 local_b48 [32];
  buffer_sink *local_b28 [2];
  undefined1 local_b18 [3];
  undefined1 uStack_b15;
  car_type cStack_b14;
  cdr_type cStack_b13;
  undefined1 uStack_b11;
  counting_policy<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
  cStack_b10;
  undefined1 local_b08 [32];
  pointer local_ae8;
  undefined1 local_ad8 [24];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [32];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a70;
  undefined8 local_a58;
  VtkFile *local_a50;
  undefined1 local_a3e [6];
  uint *local_a38;
  undefined8 local_a30;
  uint local_a28;
  undefined4 uStack_a24;
  undefined4 uStack_a20;
  undefined4 uStack_a1c;
  pointer local_a18;
  undefined8 local_a10;
  undefined8 local_a08;
  undefined4 uStack_a00;
  undefined4 uStack_9fc;
  long *local_9f8;
  undefined1 local_9f0 [8];
  undefined1 local_9e8 [24];
  char local_9d0 [16];
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_9c0;
  string local_9b8 [16];
  char local_9a8 [16];
  vtable_base *local_998;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_978;
  _Alloc_hider local_970;
  char local_960 [16];
  vtable_base *local_950;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::UnstructuredGrid_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::UnstructuredGrid_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_930;
  _Alloc_hider local_928;
  char local_918 [16];
  vtable_base *local_908;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_8e8;
  _Alloc_hider local_8e0;
  char local_8d0 [16];
  vtable_base *local_8c0;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_8a0;
  _Alloc_hider local_898;
  char local_888 [16];
  vtable_base *local_878 [4];
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_858;
  undefined1 local_850 [88];
  char local_7f8 [16];
  vtable_base *local_7e8 [4];
  undefined1 local_7c8 [8];
  _Alloc_hider local_7c0;
  char local_7b0 [16];
  vtable_base *local_7a0;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::CellType,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::CellType,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_780;
  _Alloc_hider local_778;
  char local_768 [16];
  vtable_base *local_758 [4];
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_738;
  _Alloc_hider local_730;
  char local_720 [16];
  vtable_base *local_710;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::FieldDataArray<int>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::FieldDataArray<int>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_6f0;
  _Alloc_hider local_6e8;
  char local_6d8 [16];
  vtable_base *local_6c8;
  undefined1 local_6a8 [8];
  _Alloc_hider local_6a0;
  counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
  local_690;
  undefined1 local_660 [8];
  _Alloc_hider local_658;
  uint local_648 [4];
  vtable_base *local_638;
  undefined1 local_618 [8];
  _Alloc_hider local_610;
  uint local_600 [4];
  vtable_base *local_5f0;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<char>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<char>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_5d0;
  _Alloc_hider local_5c8;
  char local_5b8 [16];
  vtable_base *local_5a8;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<unsigned_char>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<unsigned_char>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_588;
  _Alloc_hider local_580;
  char local_570 [16];
  vtable_base *local_560;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<short>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<short>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_540;
  _Alloc_hider local_538;
  char local_528 [16];
  vtable_base *local_518;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<unsigned_short>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<unsigned_short>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_4f8;
  _Alloc_hider local_4f0;
  char local_4e0 [16];
  vtable_base *local_4d0;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<int>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<int>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_4b0;
  _Alloc_hider local_4a8;
  char local_498 [16];
  vtable_base *local_488;
  undefined1 local_468 [8];
  _Alloc_hider local_460;
  char local_450 [16];
  vtable_base *local_440;
  undefined1 local_420 [8];
  _Alloc_hider local_418;
  counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
  local_408;
  undefined1 local_3d8 [8];
  _Alloc_hider local_3d0;
  counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
  local_3c0;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_390;
  _Alloc_hider local_388;
  char local_378 [16];
  vtable_base *local_368;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_348;
  _Alloc_hider local_340;
  char local_330 [16];
  vtable_base *local_320;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::VectorData<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::VectorData<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_300;
  undefined1 local_2f8 [72];
  string local_2b0 [16];
  char local_2a0 [16];
  vtable_base *local_290;
  char *local_270 [2];
  counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
  local_260;
  counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
  **local_240;
  undefined1 *local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(string *)filename,_S_trunc|_S_out|_S_bin);
  anon_unknown_1::ValidateVtkFile(vtk_file);
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 == '\0') {
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9e8,
                   "Could not open file ",filename);
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_9e8," for writing.");
    local_a18 = (pointer)&local_a08;
    pcVar10 = (pbVar8->_M_dataplus)._M_p;
    paVar11 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar10 == paVar11) {
      local_a08 = paVar11->_M_allocated_capacity;
      uStack_a00 = *(undefined4 *)((long)&pbVar8->field_2 + 8);
      uStack_9fc = *(undefined4 *)((long)&pbVar8->field_2 + 0xc);
      pcVar10 = local_a18;
    }
    else {
      local_a08 = paVar11->_M_allocated_capacity;
    }
    sVar2 = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    *puVar9 = &PTR__LfException_004d4a40;
    puVar9[1] = puVar9 + 3;
    if (pcVar10 == local_a18) {
      *(undefined4 *)(puVar9 + 3) = (undefined4)local_a08;
      *(undefined4 *)((long)puVar9 + 0x1c) = local_a08._4_4_;
      *(undefined4 *)(puVar9 + 4) = uStack_a00;
      *(undefined4 *)((long)puVar9 + 0x24) = uStack_9fc;
    }
    else {
      puVar9[1] = pcVar10;
      puVar9[3] = local_a08;
    }
    puVar9[2] = sVar2;
    local_a10 = 0;
    local_a08 = local_a08 & 0xffffffffffffff00;
    __cxa_throw(puVar9,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
  }
  local_9f0 = (undefined1  [8])0x0;
  _local_b18 = (buffer_sink *)local_b08;
  local_a50 = vtk_file;
  local_9f8 = &local_230;
  local_9e8._0_8_ = &local_9c0;
  local_9c0.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_9c0;
  if (vtk_file->format != BINARY) {
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x6d617267;
    local_b08[0xc] = 0x6d;
    local_b08._13_2_ = 0x7261;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xf;
    local_b08[0xf] = 0;
    local_9e8._8_8_ = local_9d0;
    std::__cxx11::string::_M_construct<char*>((string *)(local_9e8 + 8),(buffer_sink *)local_b08);
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_9b8._0_8_ = local_9a8;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>(local_9b8,(buffer_sink *)local_b08);
    local_998 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_978.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_978;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_970._M_p = local_960;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_970,(buffer_sink *)local_b08);
    local_950 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_930.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::UnstructuredGrid_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_930;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_928._M_p = local_918;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_928,(buffer_sink *)local_b08);
    local_908 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_8e0._M_p = local_8d0;
    _local_b18 = (buffer_sink *)local_b08;
    local_8e8.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
            )&local_8e8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_8e0,(buffer_sink *)local_b08);
    local_8c0 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_8a0.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_8a0;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_898._M_p = local_888;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_898,(buffer_sink *)local_b08);
    local_878[0] = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_858.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_858;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_850._0_8_ = (long)local_850 + 0x10;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)local_850,(buffer_sink *)local_b08);
    local_850._32_8_ = 0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_850._64_8_ = local_850 + 0x40;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_850._72_8_ = local_7f8;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)(local_850 + 0x48),(buffer_sink *)local_b08)
    ;
    local_7e8[0] = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_7c8 = (undefined1  [8])local_7c8;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_7c0._M_p = local_7b0;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_7c0,(buffer_sink *)local_b08);
    local_7a0 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_780.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::CellType,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_780;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_778._M_p = local_768;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_778,(buffer_sink *)local_b08);
    local_758[0] = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_738.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_738;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_730._M_p = local_720;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_730,(buffer_sink *)local_b08);
    local_710 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_6f0.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::FieldDataArray<int>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_6f0;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_6e8._M_p = local_6d8;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_6e8,(buffer_sink *)local_b08);
    local_6c8 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_6a8 = (undefined1  [8])local_6a8;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_6a0._M_p = (pointer)&local_690;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_6a0,(buffer_sink *)local_b08);
    local_690.prev_count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_660 = (undefined1  [8])local_660;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_658._M_p = (pointer)local_648;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_658,(buffer_sink *)local_b08);
    local_638 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_618 = (undefined1  [8])local_618;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_610._M_p = (pointer)local_600;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_610,(buffer_sink *)local_b08);
    local_5f0 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_5d0.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<char>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_5d0;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_5c8._M_p = local_5b8;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_5c8,(buffer_sink *)local_b08);
    local_5a8 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_588.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<unsigned_char>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_588;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_580._M_p = local_570;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_580,(buffer_sink *)local_b08);
    local_560 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_540.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<short>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_540;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_538._M_p = local_528;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_538,(buffer_sink *)local_b08);
    local_518 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_4f8.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<unsigned_short>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_4f8;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_4f0._M_p = local_4e0;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_4f0,(buffer_sink *)local_b08);
    local_4d0 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_4b0.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<int>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_4b0;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_4a8._M_p = local_498;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_4a8,(buffer_sink *)local_b08);
    local_488 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_468 = (undefined1  [8])local_468;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_460._M_p = local_450;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_460,(buffer_sink *)local_b08);
    local_440 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_420 = (undefined1  [8])local_420;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_418._M_p = (pointer)&local_408;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_418,(buffer_sink *)local_b08);
    local_408.prev_count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_3d8 = (undefined1  [8])local_3d8;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_3d0._M_p = (pointer)&local_3c0;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_3d0,(buffer_sink *)local_b08);
    local_3c0.prev_count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_390.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_390;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_388._M_p = local_378;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_388,(buffer_sink *)local_b08);
    local_368 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_348.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_348;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_340._M_p = local_330;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)&local_340,(buffer_sink *)local_b08);
    local_320 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_300.proto_expr_.child0.ref.t_ =
         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::VectorData<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&local_300;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_2f8._0_8_ = (long)local_2f8 + 0x10;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>((string *)local_2f8,(buffer_sink *)local_b08);
    local_2f8._32_8_ = 0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    local_2f8._64_8_ = local_2f8 + 0x40;
    local_b08._0_7_ = 0x64656d616e6e75;
    local_b08[7] = 0x2d;
    local_b08._8_4_ = 0x656c7572;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0xc;
    local_b08[0xc] = 0;
    local_2b0._0_8_ = local_2a0;
    _local_b18 = (buffer_sink *)local_b08;
    std::__cxx11::string::_M_construct<char*>(local_2b0,(buffer_sink *)local_b08);
    local_290 = (vtable_base *)0x0;
    if (_local_b18 != (buffer_sink *)local_b08) {
      operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
    }
    bVar4.buffer = _local_b18;
    local_b18[1] = ' ';
    bVar5.buffer = _local_b18;
    _cStack_b14 = SUB84(bVar4.buffer,4);
    local_b18 = SUB83(bVar5.buffer,0);
    uStack_b15 = 0x20;
    boost::
    function<bool(boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,mpl_::int_<15>,boost::spirit::unused_type>&,boost::spirit::context<boost::fusion::cons<std::vector<Eigen::Matrix<float,3,1,0,3,1>,std::allocator<Eigen::Matrix<float,3,1,0,3,1>>>const&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
    ::operator=((function<bool(boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,mpl_::int_<15>,boost::spirit::unused_type>&,boost::spirit::context<boost::fusion::cons<std::vector<Eigen::Matrix<float,3,1,0,3,1>,std::allocator<Eigen::Matrix<float,3,1,0,3,1>>>const&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
                 *)local_878,
                (generator_binder<boost::spirit::karma::kleene<boost::spirit::karma::sequence<boost::fusion::cons<boost::spirit::karma::any_real_generator<float,_boost::spirit::karma::real_policies<float>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::fusion::cons<boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,_boost::spirit::unused_type,_true>,_boost::fusion::cons<boost::spirit::karma::any_real_generator<float,_boost::spirit::karma::real_policies<float>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::fusion::cons<boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,_boost::spirit::unused_type,_true>,_boost::fusion::cons<boost::spirit::karma::any_real_generator<float,_boost::spirit::karma::real_policies<float>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::fusion::cons<boost::spirit::karma::eol_generator,_boost::fusion::nil_>_>_>_>_>_>_>_>,_mpl_::bool_<true>_>
                 *)local_b18);
    local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
    local_b48._16_8_ = "POINTS ";
    local_b28[1] = (buffer_sink *)local_b58;
    local_b58._0_8_ = &boost::spirit::uint_;
    local_b58._8_8_ = local_ac0;
    local_b48._0_8_ = " float";
    local_ad8._8_8_ = &boost::spirit::eol;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)local_b68;
    local_b68[0] = (char *)&local_8a0;
    local_b68[1] = local_ab0;
    _local_b18 = (buffer_sink *)local_ad8;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,std::vector<Eigen::Matrix<float,3,1,0,3,1>,std::allocator<Eigen::Matrix<float,3,1,0,3,1>>>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[8]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::uint_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail:___spirit::argument<0>>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>const&>,2l>const&>,2l>>
              (&local_8e8);
    bVar4.buffer = _local_b18;
    cStack_b14.ch = ' ';
    uStack_b11 = SUB81(bVar4.buffer,7);
    cStack_b13 = (cdr_type)0x2000;
    boost::
    function<bool(boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,mpl_::int_<15>,boost::spirit::unused_type>&,boost::spirit::context<boost::fusion::cons<std::vector<unsigned_int,std::allocator<unsigned_int>>const&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
    ::operator=((function<bool(boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,mpl_::int_<15>,boost::spirit::unused_type>&,boost::spirit::context<boost::fusion::cons<std::vector<unsigned_int,std::allocator<unsigned_int>>const&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
                 *)local_7e8,
                (generator_binder<boost::spirit::karma::sequence<boost::fusion::cons<boost::spirit::karma::lazy_generator<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::lit>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::size>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>_>,_2L>_>,_boost::spirit::unused_type>,_boost::fusion::cons<boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,_boost::spirit::unused_type,_true>,_boost::fusion::cons<boost::spirit::karma::list<boost::spirit::karma::any_uint_generator<unsigned_int,_boost::spirit::unused_type,_boost::spirit::unused_type,_10U>,_boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,_boost::spirit::unused_type,_true>_>,_boost::fusion::cons<boost::spirit::karma::eol_generator,_boost::fusion::nil_>_>_>_>_>,_mpl_::bool_<true>_>
                 *)local_b18);
    local_b48._0_8_ = "CELLS ";
    local_b68[0] = &boost::spirit::uint_;
    local_b68[1] = local_aa0 + 0x10;
    local_b58._8_8_ = local_b68;
    local_b48._24_8_ = &local_a70;
    local_a70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = ' ';
    local_b48._16_8_ = local_b58;
    local_ac0._0_8_ = &boost::spirit::uint_;
    local_ac0._8_8_ = (long)local_a90 + 0x10;
    local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
    local_b28[1] = (buffer_sink *)local_ac0;
    local_ab0._0_8_ = local_aa0;
    local_aa0._0_8_ = local_850 + 0x40;
    local_ab0._8_8_ =
         (long)&local_a70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 0x10;
    local_ad8._8_8_ = local_ab0;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)&boost::spirit::eol;
    local_b58._0_8_ = local_b48;
    _local_b18 = (buffer_sink *)local_ad8;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
    ::define<_ff87bce2_>(&local_858);
    boost::
    function<bool(boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,mpl_::int_<15>,boost::spirit::unused_type>&,boost::spirit::context<boost::fusion::cons<lf::io::VtkFile::CellType_const&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
    ::operator=((function<bool(boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,mpl_::int_<15>,boost::spirit::unused_type>&,boost::spirit::context<boost::fusion::cons<lf::io::VtkFile::CellType_const&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
                 *)local_758,
                (generator_binder<boost::spirit::karma::sequence<boost::fusion::cons<boost::spirit::karma::action<boost::spirit::karma::any_int_generator<int,_boost::spirit::unused_type,_boost::spirit::unused_type,_10U,_false>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::argument<0>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::static_cast_,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::detail::target<int>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>_>,_2L>_>_>,_boost::fusion::cons<boost::spirit::karma::eol_generator,_boost::fusion::nil_>_>_>,_mpl_::bool_<false>_>
                 *)local_b18);
    local_b28[0] = (buffer_sink *)0x40b1f9;
    local_b48._16_8_ = &boost::spirit::uint_;
    local_b48._24_8_ = local_b68;
    pvVar1 = (pointer)(local_b48 + 0x10);
    local_ad8._8_8_ = &boost::spirit::eol;
    local_b48._0_8_ = &local_780;
    local_b58._8_8_ = local_ac0;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)local_b58;
    local_b58._0_8_ = local_b48;
    _local_b18 = (buffer_sink *)local_ad8;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,std::vector<lf::io::VtkFile::CellType,std::allocator<lf::io::VtkFile::CellType>>,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[12]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::uint_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::phoenix::stl::size>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>>,2l>>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::CellType,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>const&>,2l>const&>,2l>>
              ((counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
                *)local_7c8);
    local_b48._16_8_ = "DATASET UNSTRUCTURED_GRID";
    local_b28[1] = (buffer_sink *)&boost::spirit::eol;
    local_ad8._8_8_ = &local_858;
    _local_b18 = (buffer_sink *)local_ad8;
    local_b28[0] = (buffer_sink *)pvVar1;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)local_7c8;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::UnstructuredGrid(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[26]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>const&,boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,std::vector<Eigen::Matrix<float,3,1,0,3,1>,std::allocator<Eigen::Matrix<float,3,1,0,3,1>>>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,std::vector<lf::io::VtkFile::CellType,std::allocator<lf::io::VtkFile::CellType>>,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>>
              (&local_930);
    local_b48._0_8_ = " 1 ";
    local_b58._0_8_ = &boost::spirit::standard::string;
    local_b58._8_8_ = local_b48;
    local_b48._24_8_ = local_ab0;
    local_b68[0] = " int";
    local_b28[1] = (buffer_sink *)local_b68;
    local_aa0[0] = ' ';
    local_ac0._0_8_ = &boost::spirit::int_;
    _local_b18 = (buffer_sink *)local_ad8;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)&boost::spirit::eol;
    local_b48._16_8_ = (pointer)local_b58;
    local_b28[0] = (buffer_sink *)pvVar1;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    local_ad8._8_8_ = (pointer)local_ac0;
    local_ac0._8_8_ = local_aa0;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::FieldDataArray<int>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
    ::define<_9178cd74_>(&local_6f0);
    local_b48._0_8_ = " 1 ";
    local_b58._0_8_ = &boost::spirit::standard::string;
    local_b58._8_8_ = local_b48;
    local_b48._24_8_ = local_ab0;
    local_b68[0] = " float";
    local_b28[1] = (buffer_sink *)local_b68;
    local_aa0[0] = ' ';
    local_ac0._0_8_ = &boost::spirit::float_;
    _local_b18 = (buffer_sink *)local_ad8;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)&boost::spirit::eol;
    local_b48._16_8_ = (pointer)local_b58;
    local_b28[0] = (buffer_sink *)pvVar1;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    local_ad8._8_8_ = (pointer)local_ac0;
    local_ac0._8_8_ = local_aa0;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::FieldDataArray<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
    ::define<_d4906d9f_>
              ((extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::FieldDataArray<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::FieldDataArray<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
                *)local_6a8);
    local_b48._0_8_ = " 1 ";
    local_b58._0_8_ = &boost::spirit::standard::string;
    local_b58._8_8_ = local_b48;
    local_b48._24_8_ = local_ab0;
    local_b68[0] = (char *)((long)"long double" + 4);
    local_b28[1] = (buffer_sink *)local_b68;
    local_aa0[0] = 0x20;
    local_ac0._0_8_ = &boost::spirit::double_;
    _local_b18 = (buffer_sink *)local_ad8;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)&boost::spirit::eol;
    local_b48._16_8_ = (pointer)local_b58;
    local_b28[0] = (buffer_sink *)pvVar1;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    local_ad8._8_8_ = (pointer)local_ac0;
    local_ac0._8_8_ = local_aa0;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::FieldDataArray<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
    ::define<_e9f4d4f7_>((pointer)local_660);
    local_b28[0] = (buffer_sink *)0x40b228;
    local_ad8._8_8_ = &boost::spirit::eol;
    local_b58._0_8_ = &local_6f0;
    local_b58._8_8_ = local_6a8;
    local_b48._16_8_ = local_b58;
    _local_b18 = (buffer_sink *)local_ad8;
    local_b48._0_8_ = pvVar1;
    local_b48._24_8_ = (pointer)local_660;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)local_b48;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,std::vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>,std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>>>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[17]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::lazy_terminal<boost::spirit::tag::lit,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::lit>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::pro___rit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&>,1l>const&>,2l>>
              (&local_738);
    local_ac0._0_8_ = "SCALARS ";
    local_b68[1] = &boost::spirit::standard::string;
    local_ab0._0_8_ = " char 1";
    local_b48._0_8_ = local_b68;
    local_b48._8_8_ = local_ab0;
    local_b58._8_8_ = &boost::spirit::eol;
    local_aa0._0_8_ = "LOOKUP_TABLE ";
    local_b48._16_8_ = local_b58;
    local_b48._24_8_ = local_aa0;
    local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
    local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
    local_a90._0_8_ = &boost::spirit::short_;
    local_a90._8_8_ = &boost::spirit::eol;
    local_a90._16_8_ = local_aa0 + 0x10;
    local_ad8._8_8_ = local_a90 + 0x10;
    _local_b18 = (buffer_sink *)local_ad8;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)&boost::spirit::eol;
    local_b68[0] = local_ac0;
    local_b58._0_8_ =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)local_b48;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<char>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
              (&local_5d0);
    local_ac0._0_8_ = "SCALARS ";
    local_b68[1] = &boost::spirit::standard::string;
    local_ab0._0_8_ = " char 1";
    local_b48._0_8_ = local_b68;
    local_b48._8_8_ = local_ab0;
    local_b58._8_8_ = &boost::spirit::eol;
    local_aa0._0_8_ = "LOOKUP_TABLE ";
    local_b48._16_8_ = local_b58;
    local_b48._24_8_ = local_aa0;
    pvVar1 = (pointer)(local_b48 + 0x10);
    local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
    local_a90._0_8_ = &boost::spirit::ushort_;
    local_a90._8_8_ = &boost::spirit::eol;
    local_a90._16_8_ = local_aa0 + 0x10;
    local_ad8._8_8_ = local_a90 + 0x10;
    _local_b18 = (buffer_sink *)local_ad8;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)&boost::spirit::eol;
    local_b68[0] = local_ac0;
    local_b58._0_8_ =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)local_b48;
    local_b28[0] = (buffer_sink *)pvVar1;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<unsigned_char>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
              (&local_588);
    local_ab0._0_8_ = " short 1";
    local_ac0._0_8_ = "SCALARS ";
    local_b68[1] = &boost::spirit::standard::string;
    local_b48._0_8_ = local_b68;
    local_b48._8_8_ = local_ab0;
    local_b58._0_8_ = local_b48;
    local_b58._8_8_ = &boost::spirit::eol;
    local_aa0._0_8_ = "LOOKUP_TABLE ";
    local_b48._16_8_ = local_b58;
    local_b48._24_8_ = local_aa0;
    local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
    local_a90._0_8_ = &boost::spirit::short_;
    local_a90._8_8_ = &boost::spirit::eol;
    local_a90._16_8_ = local_aa0 + 0x10;
    local_ad8._8_8_ = local_a90 + 0x10;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)&boost::spirit::eol;
    local_b68[0] = local_ac0;
    local_b28[0] = (buffer_sink *)pvVar1;
    _local_b18 = (buffer_sink *)local_ad8;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<short>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
              (&local_540);
    local_ab0._0_8_ = " unsigned_short 1";
    local_ac0._0_8_ = "SCALARS ";
    local_b68[1] = &boost::spirit::standard::string;
    local_b48._0_8_ = local_b68;
    local_b48._8_8_ = local_ab0;
    local_b58._0_8_ = local_b48;
    local_b58._8_8_ = &boost::spirit::eol;
    local_aa0._0_8_ = "LOOKUP_TABLE ";
    local_b48._16_8_ = local_b58;
    local_b48._24_8_ = local_aa0;
    local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
    local_a90._0_8_ = &boost::spirit::ushort_;
    local_a90._8_8_ = &boost::spirit::eol;
    local_a90._16_8_ = local_aa0 + 0x10;
    local_ad8._8_8_ = local_a90 + 0x10;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)&boost::spirit::eol;
    local_b68[0] = local_ac0;
    local_b28[0] = (buffer_sink *)pvVar1;
    _local_b18 = (buffer_sink *)local_ad8;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<unsigned_short>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
              (&local_4f8);
    local_ab0._0_8_ = " int 1";
    local_ac0._0_8_ = "SCALARS ";
    local_b68[1] = &boost::spirit::standard::string;
    local_b48._0_8_ = local_b68;
    local_b48._8_8_ = local_ab0;
    local_b58._0_8_ = local_b48;
    local_b58._8_8_ = &boost::spirit::eol;
    local_aa0._0_8_ = "LOOKUP_TABLE ";
    local_b48._16_8_ = local_b58;
    local_b48._24_8_ = local_aa0;
    local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
    local_a90._0_8_ = &boost::spirit::int_;
    local_a90._8_8_ = &boost::spirit::eol;
    local_a90._16_8_ = local_aa0 + 0x10;
    local_ad8._8_8_ = local_a90 + 0x10;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)&boost::spirit::eol;
    local_b68[0] = local_ac0;
    local_b28[0] = (buffer_sink *)pvVar1;
    _local_b18 = (buffer_sink *)local_ad8;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<int>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
              (&local_4b0);
    local_ab0._0_8_ = " unsigned_int 1";
    local_ac0._0_8_ = "SCALARS ";
    local_b68[1] = &boost::spirit::standard::string;
    local_b48._0_8_ = local_b68;
    local_b48._8_8_ = local_ab0;
    local_b58._0_8_ = local_b48;
    local_b58._8_8_ = &boost::spirit::eol;
    local_aa0._0_8_ = "LOOKUP_TABLE ";
    local_b48._16_8_ = local_b58;
    local_b48._24_8_ = local_aa0;
    local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
    local_a90._0_8_ = &boost::spirit::uint_;
    local_a90._8_8_ = &boost::spirit::eol;
    local_a90._16_8_ = local_aa0 + 0x10;
    local_ad8._8_8_ = local_a90 + 0x10;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)&boost::spirit::eol;
    local_b68[0] = local_ac0;
    local_b28[0] = (buffer_sink *)pvVar1;
    _local_b18 = (buffer_sink *)local_ad8;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<unsigned_int>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
              ((extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<unsigned_int>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<unsigned_int>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
                *)local_468);
    local_ac0._0_8_ = "SCALARS ";
    local_b68[1] = &boost::spirit::standard::string;
    local_ab0._0_8_ = " long 1";
    local_b48._0_8_ = local_b68;
    local_b48._8_8_ = local_ab0;
    local_b58._0_8_ = local_b48;
    local_b58._8_8_ = &boost::spirit::eol;
    local_aa0._0_8_ = "LOOKUP_TABLE ";
    local_b48._16_8_ = local_b58;
    local_b48._24_8_ = local_aa0;
    local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
    local_a90._0_8_ = &boost::spirit::long_;
    local_a90._8_8_ = &boost::spirit::eol;
    local_a90._16_8_ = local_aa0 + 0x10;
    local_ad8._8_8_ = local_a90 + 0x10;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)&boost::spirit::eol;
    local_b68[0] = local_ac0;
    local_b28[0] = (buffer_sink *)pvVar1;
    _local_b18 = (buffer_sink *)local_ad8;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<long>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
              ((extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<long>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<long>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
                *)local_420);
    local_ac0._0_8_ = "SCALARS ";
    local_b68[1] = &boost::spirit::standard::string;
    local_ab0._0_8_ = " unsigned_long 1";
    local_b48._0_8_ = local_b68;
    local_b48._8_8_ = local_ab0;
    local_b58._0_8_ = local_b48;
    local_b58._8_8_ = &boost::spirit::eol;
    local_aa0._0_8_ = "LOOKUP_TABLE ";
    local_b48._16_8_ = local_b58;
    local_b48._24_8_ = local_aa0;
    local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
    local_a90._0_8_ = &boost::spirit::ulong_;
    local_a90._8_8_ = &boost::spirit::eol;
    local_a90._16_8_ = local_aa0 + 0x10;
    local_ad8._8_8_ = local_a90 + 0x10;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)&boost::spirit::eol;
    local_b68[0] = local_ac0;
    local_b28[0] = (buffer_sink *)pvVar1;
    _local_b18 = (buffer_sink *)local_ad8;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<unsigned_long>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
              (local_3d8);
    local_ac0._0_8_ = "SCALARS ";
    local_b68[1] = &boost::spirit::standard::string;
    local_ab0._0_8_ = " float 1";
    local_b48._0_8_ = local_b68;
    local_b48._8_8_ = local_ab0;
    local_b58._0_8_ = local_b48;
    local_b58._8_8_ = &boost::spirit::eol;
    local_aa0._0_8_ = "LOOKUP_TABLE ";
    local_b48._16_8_ = local_b58;
    local_b48._24_8_ = local_aa0;
    local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
    local_a90._0_8_ = &boost::spirit::float_;
    local_a90._8_8_ = &boost::spirit::eol;
    local_a90._16_8_ = local_aa0 + 0x10;
    local_ad8._8_8_ = local_a90 + 0x10;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)&boost::spirit::eol;
    local_b68[0] = local_ac0;
    local_b28[0] = (buffer_sink *)pvVar1;
    _local_b18 = (buffer_sink *)local_ad8;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<float>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
              (&local_390);
    local_ac0._0_8_ = "SCALARS ";
    local_ab0._0_8_ = " double 1";
    local_b68[1] = &boost::spirit::standard::string;
    local_b48._0_8_ = local_b68;
    local_b48._8_8_ = local_ab0;
    local_b58._0_8_ = local_b48;
    local_b58._8_8_ = &boost::spirit::eol;
    local_aa0._0_8_ = "LOOKUP_TABLE ";
    local_b48._16_8_ = local_b58;
    local_b48._24_8_ = local_aa0;
    local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
    local_a90._0_8_ = &boost::spirit::double_;
    local_a90._8_8_ = &boost::spirit::eol;
    local_a90._16_8_ = local_aa0 + 0x10;
    local_ad8._8_8_ = local_a90 + 0x10;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)&boost::spirit::eol;
    local_b68[0] = local_ac0;
    local_b28[0] = (buffer_sink *)pvVar1;
    _local_b18 = (buffer_sink *)local_ad8;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<double>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
              (&local_348);
    local_b58._0_8_ = " float";
    local_b48._16_8_ = "VECTORS ";
    local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
    local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
    local_ad8._8_8_ = &boost::spirit::eol;
    local_a90[0x10] = ' ';
    local_aa0._0_8_ = &boost::spirit::float_;
    local_aa0._8_8_ = local_a90 + 0x10;
    local_ab0._0_8_ = local_aa0;
    local_ab0._8_8_ = &boost::spirit::float_;
    local_a70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = ' ';
    local_ac0._0_8_ = local_ab0;
    local_b68[1] = &boost::spirit::float_;
    local_b48._0_8_ = local_b68;
    local_b48._8_8_ = &boost::spirit::eol;
    local_a90._0_8_ = local_b48;
    _local_b18 = (buffer_sink *)local_ad8;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)(local_aa0 + 0x10);
    local_b68[0] = local_ac0;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    local_ac0._8_8_ = &local_a70;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::VectorData<float>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[7]>>>,0l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::___:terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>const&>,1l>const&>_2l>>
              (&local_300);
    local_b48._16_8_ = "VECTORS ";
    local_b58._0_8_ = " double";
    local_aa0._0_8_ = &boost::spirit::double_;
    local_ab0._0_8_ = local_aa0;
    local_ab0._8_8_ = &boost::spirit::double_;
    local_b68[1] = &boost::spirit::double_;
    _local_b18 = (buffer_sink *)local_ad8;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)(local_aa0 + 0x10);
    local_a90[0x10] = 0x20;
    local_a70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_a70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
    local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
    local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
    local_ad8._8_8_ = &boost::spirit::eol;
    local_aa0._8_8_ = local_a90 + 0x10;
    local_b48._0_8_ = local_b68;
    local_b48._8_8_ = &boost::spirit::eol;
    local_a90._0_8_ = local_b48;
    local_b68[0] = local_ac0;
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    local_ac0._0_8_ = local_ab0;
    local_ac0._8_8_ = &local_a70;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::VectorData<double>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[8]>>>,0l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::___:terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>const&>,1l>const&>_2l>>
              ((counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
                *)(local_2f8 + 0x40),local_b18);
    local_aa0._0_8_ = &local_5d0;
    local_aa0._8_8_ = &local_588;
    local_ab0._0_8_ = local_aa0;
    local_ab0._8_8_ = &local_540;
    local_ac0._8_8_ = &local_4f8;
    local_b68[0] = local_ac0;
    local_b68[1] = (char *)&local_4b0;
    local_b48._0_8_ = local_b68;
    local_b48._8_8_ = local_468;
    local_b58._0_8_ = local_b48;
    local_b58._8_8_ = local_420;
    local_b48._16_8_ = local_b58;
    local_b48._24_8_ = local_3d8;
    local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
    local_b28[1] = (buffer_sink *)&local_390;
    local_ad8._8_8_ = &local_300;
    _local_b18 = (buffer_sink *)local_ad8;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)(local_2f8 + 0x40);
    local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
    local_ac0._0_8_ = local_ab0;
    local_a90._0_8_ = local_b18;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,std::vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
    ::
    define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::e___,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&>,1l>>
              ((counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
                *)local_618,local_aa0 + 0x10);
    local_240 = &local_260.prev_count;
    local_260.prev_count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0x40b2bf;
    local_a70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&local_240;
    local_238 = &boost::spirit::eol;
    local_a58 = &boost::spirit::standard::string;
    local_a70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_a70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  + 0x10);
    local_a90._16_8_ = &local_a70;
    local_a90._24_8_ = &boost::spirit::stream;
    local_a90._0_8_ = local_a90 + 0x10;
    local_ab0._0_8_ = local_aa0;
    local_b68[1] = (char *)&local_260;
    local_260.count = 0x40b2da;
    local_b68[0] = local_ac0;
    local_b48._0_8_ = local_b68;
    local_b48._8_8_ = local_a3e;
    local_b58._0_8_ = local_b48;
    local_b48._16_8_ = local_b58;
    local_b28[1] = (buffer_sink *)local_270;
    local_270[0] = "CELL_DATA ";
    local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
    local_a70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&boost::spirit::eol;
    local_a90._8_8_ = &boost::spirit::eol;
    local_ab0._8_8_ = &boost::spirit::eol;
    local_b58._8_8_ = &boost::spirit::eol;
    local_ad8._8_8_ = &boost::spirit::eol;
    _local_b18 = (buffer_sink *)local_ad8;
    local_ac0._8_8_ = &local_738;
    local_b48._24_8_ =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)local_618;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)local_618;
    local_ad8._0_8_ = (VtkFile *)&stack0xfffffffffffff488;
    local_ac0._0_8_ = local_ab0;
    local_aa0._0_8_ = local_aa0 + 0x10;
    local_aa0._8_8_ = &local_930;
    boost::spirit::karma::
    rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
    ::define<_8e269db2_>(&local_9c0);
    _local_b18 = (buffer_sink *)0x0;
    cStack_b10.count =
         (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
          *)0x0;
    local_b08._0_7_ = 0;
    local_b08[7] = 0;
    local_b08._8_4_ = 1;
    local_b08[0xc] = 0;
    local_b08._13_2_ = 0;
    local_b08[0xf] = 0;
    local_b08._16_8_ = (pointer)0x1;
    local_b08[0x18] = true;
    local_ae8 = (pointer)&local_9f8;
    if (((reference_wrapper<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          *)&(((function_type *)(local_9e8._0_8_ + 0x28))->
             super_function_n<bool,_boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_lf::io::VtkFile_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
             ).super_function_base.vtable)->t_ ==
        (rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
         *)0x0) {
LAB_001c88e5:
      bVar3 = false;
    }
    else {
      local_ad8._0_8_ = local_a50;
      rVar7 = boost::
              function_n<bool,_boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_lf::io::VtkFile_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
              ::operator()((function_n<bool,_boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_lf::io::VtkFile_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                            *)(local_9e8._0_8_ + 0x28),
                           (output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>
                            *)local_b18,
                           (context<boost::fusion::cons<const_lf::io::VtkFile_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>
                            *)local_ad8,(unused_type *)&boost::spirit::unused);
      bVar3 = true;
      if (!rVar7) goto LAB_001c88e5;
    }
    anon_unknown_1::
    VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_false>::
    ~VtkGrammar((VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_false>
                 *)local_9e8);
    goto LAB_001c88f4;
  }
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x6d617267;
  local_b08[0xc] = 0x6d;
  local_b08._13_2_ = 0x7261;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xf;
  local_b08[0xf] = 0;
  local_9e8._8_8_ = local_9d0;
  std::__cxx11::string::_M_construct<char*>((string *)(local_9e8 + 8),(buffer_sink *)local_b08);
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_9b8._0_8_ = local_9a8;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>(local_9b8,(buffer_sink *)local_b08);
  local_998 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_978.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_978;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_970._M_p = local_960;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_970,(buffer_sink *)local_b08);
  local_950 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_930.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::UnstructuredGrid_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_930;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_928._M_p = local_918;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_928,(buffer_sink *)local_b08);
  local_908 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_8e8.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_8e8;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_8e0._M_p = local_8d0;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_8e0,(buffer_sink *)local_b08);
  local_8c0 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_8a0.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_8a0;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_898._M_p = local_888;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_898,(buffer_sink *)local_b08);
  local_878[0] = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_858.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_858;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_850._0_8_ = (long)local_850 + 0x10;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)local_850,(buffer_sink *)local_b08);
  local_850._32_8_ = 0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_850._64_8_ = local_850 + 0x40;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_850._72_8_ = local_7f8;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)(local_850 + 0x48),(buffer_sink *)local_b08);
  local_7e8[0] = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_7c8 = (undefined1  [8])local_7c8;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_7c0._M_p = local_7b0;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_7c0,(buffer_sink *)local_b08);
  local_7a0 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_780.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::CellType,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_780;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_778._M_p = local_768;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_778,(buffer_sink *)local_b08);
  local_758[0] = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_738.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_738;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_730._M_p = local_720;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_730,(buffer_sink *)local_b08);
  local_710 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_6f0.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::FieldDataArray<int>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_6f0;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_6e8._M_p = local_6d8;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_6e8,(buffer_sink *)local_b08);
  local_6c8 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_6a8 = (undefined1  [8])local_6a8;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_6a0._M_p = (pointer)&local_690;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_6a0,(buffer_sink *)local_b08);
  local_690.prev_count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_660 = (undefined1  [8])local_660;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_658._M_p = (pointer)local_648;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_658,(buffer_sink *)local_b08);
  local_638 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_618 = (undefined1  [8])local_618;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_610._M_p = (pointer)local_600;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_610,(buffer_sink *)local_b08);
  local_5f0 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_5d0.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<char>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_5d0;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_5c8._M_p = local_5b8;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_5c8,(buffer_sink *)local_b08);
  local_5a8 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_588.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<unsigned_char>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_588;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_580._M_p = local_570;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_580,(buffer_sink *)local_b08);
  local_560 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_540.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<short>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_540;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_538._M_p = local_528;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_538,(buffer_sink *)local_b08);
  local_518 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_4f8.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<unsigned_short>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_4f8;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_4f0._M_p = local_4e0;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_4f0,(buffer_sink *)local_b08);
  local_4d0 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_4b0.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<int>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_4b0;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_4a8._M_p = local_498;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_4a8,(buffer_sink *)local_b08);
  local_488 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_468 = (undefined1  [8])local_468;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_460._M_p = local_450;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_460,(buffer_sink *)local_b08);
  local_440 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_420 = (undefined1  [8])local_420;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_418._M_p = (pointer)&local_408;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_418,(buffer_sink *)local_b08);
  local_408.prev_count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_3d8 = (undefined1  [8])local_3d8;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_3d0._M_p = (pointer)&local_3c0;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_3d0,(buffer_sink *)local_b08);
  local_3c0.prev_count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_390.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_390;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_388._M_p = local_378;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_388,(buffer_sink *)local_b08);
  local_368 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_348.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_348;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_340._M_p = local_330;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)&local_340,(buffer_sink *)local_b08);
  local_320 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_300.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::VectorData<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_300;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_2f8._0_8_ = (long)local_2f8 + 0x10;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>((string *)local_2f8,(buffer_sink *)local_b08);
  local_2f8._32_8_ = 0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  local_2f8._64_8_ = local_2f8 + 0x40;
  local_b08._0_7_ = 0x64656d616e6e75;
  local_b08[7] = 0x2d;
  local_b08._8_4_ = 0x656c7572;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0xc;
  local_b08[0xc] = 0;
  local_2b0._0_8_ = local_2a0;
  _local_b18 = (buffer_sink *)local_b08;
  std::__cxx11::string::_M_construct<char*>(local_2b0,(buffer_sink *)local_b08);
  local_290 = (vtable_base *)0x0;
  if (_local_b18 != (buffer_sink *)local_b08) {
    operator_delete(_local_b18,CONCAT17(local_b08[7],local_b08._0_7_) + 1);
  }
  boost::
  function<bool(boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,mpl_::int_<15>,boost::spirit::unused_type>&,boost::spirit::context<boost::fusion::cons<std::vector<Eigen::Matrix<float,3,1,0,3,1>,std::allocator<Eigen::Matrix<float,3,1,0,3,1>>>const&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
  ::operator=((function<bool(boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,mpl_::int_<15>,boost::spirit::unused_type>&,boost::spirit::context<boost::fusion::cons<std::vector<Eigen::Matrix<float,3,1,0,3,1>,std::allocator<Eigen::Matrix<float,3,1,0,3,1>>>const&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
               *)local_878,
              (generator_binder<boost::spirit::karma::sequence<boost::fusion::cons<boost::spirit::karma::kleene<boost::spirit::karma::sequence<boost::fusion::cons<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::floating_point<32>,_(boost::endian::order)0,_32>,_boost::fusion::cons<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::floating_point<32>,_(boost::endian::order)0,_32>,_boost::fusion::cons<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::floating_point<32>,_(boost::endian::order)0,_32>,_boost::fusion::nil_>_>_>_>_>,_boost::fusion::cons<boost::spirit::karma::eol_generator,_boost::fusion::nil_>_>_>,_mpl_::bool_<true>_>
               *)local_b18);
  local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
  local_b48._16_8_ = "POINTS ";
  local_b28[1] = (buffer_sink *)local_b58;
  local_b58._0_8_ = &boost::spirit::uint_;
  local_b58._8_8_ = local_ac0;
  f.g = SUB84(local_b28,0);
  local_b48._0_8_ = " float";
  local_ad8._8_8_ = &boost::spirit::eol;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)local_b68;
  local_b68[0] = (char *)&local_8a0;
  local_b68[1] = local_ab0;
  _local_b18 = (buffer_sink *)local_ad8;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,std::vector<Eigen::Matrix<float,3,1,0,3,1>,std::allocator<Eigen::Matrix<float,3,1,0,3,1>>>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[8]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::uint_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail:___spirit::argument<0>>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>const&>,2l>const&>,2l>>
            (&local_8e8);
  boost::
  function<bool(boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,mpl_::int_<15>,boost::spirit::unused_type>&,boost::spirit::context<boost::fusion::cons<std::vector<unsigned_int,std::allocator<unsigned_int>>const&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
  ::operator=((function<bool(boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,mpl_::int_<15>,boost::spirit::unused_type>&,boost::spirit::context<boost::fusion::cons<std::vector<unsigned_int,std::allocator<unsigned_int>>const&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
               *)local_7e8,
              (generator_binder<boost::spirit::karma::sequence<boost::fusion::cons<boost::spirit::karma::lazy_generator<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::big_dword>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::size>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>_>,_2L>_>,_boost::spirit::unused_type>,_boost::fusion::cons<boost::spirit::karma::kleene<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<32>,_(boost::endian::order)0,_32>_>,_boost::fusion::nil_>_>_>,_mpl_::bool_<true>_>
               *)local_b18);
  local_b48._0_8_ = "CELLS ";
  local_b68[0] = &boost::spirit::uint_;
  local_b68[1] = local_aa0 + 0x10;
  local_b58._8_8_ = local_b68;
  local_b48._24_8_ = &local_a70;
  local_a70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_a70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
  local_b48._16_8_ = local_b58;
  local_ac0._0_8_ = &boost::spirit::uint_;
  local_ac0._8_8_ = (long)local_a90 + 0x10;
  local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
  local_b28[1] = (buffer_sink *)local_ac0;
  local_ab0._0_8_ = local_aa0;
  local_aa0._0_8_ = local_850 + 0x40;
  local_ab0._8_8_ =
       (long)&local_a70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 0x10;
  local_ad8._8_8_ = local_ab0;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)&boost::spirit::eol;
  local_b58._0_8_ = (pointer)local_b48;
  _local_b18 = (buffer_sink *)local_ad8;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_ff87bce2_>(&local_858);
  boost::
  function<bool(boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,mpl_::int_<15>,boost::spirit::unused_type>&,boost::spirit::context<boost::fusion::cons<lf::io::VtkFile::CellType_const&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
  ::operator=((function<bool(boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,mpl_::int_<15>,boost::spirit::unused_type>&,boost::spirit::context<boost::fusion::cons<lf::io::VtkFile::CellType_const&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
               *)local_758,f);
  local_b28[0] = (buffer_sink *)0x40b1f9;
  local_b48._16_8_ = &boost::spirit::uint_;
  local_b48._24_8_ = local_b68;
  local_ad8._8_8_ = &boost::spirit::eol;
  local_b48._0_8_ = &local_780;
  local_b58._8_8_ = local_ac0;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)local_b58;
  local_b58._0_8_ = (pointer)local_b48;
  _local_b18 = (buffer_sink *)local_ad8;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,std::vector<lf::io::VtkFile::CellType,std::allocator<lf::io::VtkFile::CellType>>,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[12]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::uint_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::phoenix::stl::size>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>>,2l>>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::CellType,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>const&>,2l>const&>,2l>>
            ((counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
              *)local_7c8);
  local_b48._16_8_ = "DATASET UNSTRUCTURED_GRID";
  local_b28[1] = (buffer_sink *)&boost::spirit::eol;
  local_ad8._8_8_ = &local_858;
  local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)local_7c8;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::UnstructuredGrid(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[26]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>const&,boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,std::vector<Eigen::Matrix<float,3,1,0,3,1>,std::allocator<Eigen::Matrix<float,3,1,0,3,1>>>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,std::vector<lf::io::VtkFile::CellType,std::allocator<lf::io::VtkFile::CellType>>,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>>
            (&local_930);
  local_b48._0_8_ = " 1 ";
  local_b58._0_8_ = &boost::spirit::standard::string;
  local_b68[0] = " int";
  local_b28[1] = (buffer_sink *)local_b68;
  local_ac0._0_8_ = &boost::spirit::big_dword;
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)&boost::spirit::eol;
  local_b58._8_8_ = (pointer)local_b48;
  local_b48._16_8_ = (pointer)local_b58;
  local_b48._24_8_ = (pointer)local_ab0;
  local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  local_ad8._8_8_ = (pointer)local_ac0;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::FieldDataArray<int>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_fc24bd10_>(&local_6f0);
  local_b48._0_8_ = " 1 ";
  local_b58._0_8_ = &boost::spirit::standard::string;
  local_b58._8_8_ = local_b48;
  local_b68[0] = " float";
  local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
  local_b28[1] = (buffer_sink *)local_b68;
  local_ac0._0_8_ = &boost::spirit::big_bin_float;
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)&boost::spirit::eol;
  local_b48._16_8_ = (pointer)local_b58;
  local_b48._24_8_ = (pointer)local_ab0;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  local_ad8._8_8_ = (pointer)local_ac0;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::FieldDataArray<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_45e50e04_>
            ((extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::FieldDataArray<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::FieldDataArray<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
              *)local_6a8);
  local_b48._0_8_ = " 1 ";
  local_b58._0_8_ = &boost::spirit::standard::string;
  local_b58._8_8_ = local_b48;
  local_b68[0] = (char *)((long)"long double" + 4);
  pvVar1 = (pointer)(local_b48 + 0x10);
  local_b28[1] = (buffer_sink *)local_b68;
  local_ac0._0_8_ = &boost::spirit::big_bin_double;
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)&boost::spirit::eol;
  local_b48._16_8_ = (pointer)local_b58;
  local_b48._24_8_ = (pointer)local_ab0;
  local_b28[0] = (buffer_sink *)pvVar1;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  local_ad8._8_8_ = (pointer)local_ac0;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::FieldDataArray<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_5979abc6_>((pointer)local_660);
  local_b28[0] = (buffer_sink *)0x40b228;
  local_ad8._8_8_ = &boost::spirit::eol;
  local_b58._0_8_ = &local_6f0;
  local_b58._8_8_ = local_6a8;
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)local_b48;
  local_b48._0_8_ = pvVar1;
  local_b48._16_8_ = (pointer)local_b58;
  local_b48._24_8_ = (pointer)local_660;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,std::vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>,std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>>>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[17]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::lazy_terminal<boost::spirit::tag::lit,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::lit>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::pro___rit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&>,1l>const&>,2l>>
            (&local_738);
  local_b48._24_8_ = local_aa0;
  local_ac0._0_8_ = "SCALARS ";
  local_b68[0] = local_ac0;
  local_b68[1] = &boost::spirit::standard::string;
  local_ab0._0_8_ = " char 1";
  local_b48._0_8_ = local_b68;
  local_b48._8_8_ = local_ab0;
  local_b58._0_8_ = local_b48;
  local_b58._8_8_ = &boost::spirit::eol;
  local_aa0._0_8_ = "LOOKUP_TABLE ";
  local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
  local_a90._0_8_ = &boost::spirit::byte_;
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)&boost::spirit::eol;
  local_b48._16_8_ = (pointer)local_b58;
  local_b28[0] = (buffer_sink *)pvVar1;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  local_ad8._8_8_ = (pointer)(local_aa0 + 0x10);
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<char>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
            (&local_5d0);
  local_ab0._0_8_ = " char 1";
  local_ac0._0_8_ = "SCALARS ";
  local_b68[0] = local_ac0;
  local_b68[1] = &boost::spirit::standard::string;
  local_b48._0_8_ = local_b68;
  local_b48._8_8_ = local_ab0;
  local_b58._0_8_ = local_b48;
  local_b58._8_8_ = &boost::spirit::eol;
  local_aa0._0_8_ = "LOOKUP_TABLE ";
  local_b48._16_8_ = local_b58;
  local_b48._24_8_ = local_aa0;
  local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
  local_a90._0_8_ = &boost::spirit::byte_;
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)&boost::spirit::eol;
  local_b28[0] = (buffer_sink *)pvVar1;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  local_ad8._8_8_ = (pointer)(local_aa0 + 0x10);
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<unsigned_char>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
            (&local_588);
  local_ac0._0_8_ = "SCALARS ";
  local_b68[0] = local_ac0;
  local_b68[1] = &boost::spirit::standard::string;
  local_ab0._0_8_ = " short 1";
  local_b48._0_8_ = local_b68;
  local_b48._8_8_ = local_ab0;
  local_b58._0_8_ = local_b48;
  local_b58._8_8_ = &boost::spirit::eol;
  local_aa0._0_8_ = "LOOKUP_TABLE ";
  local_b48._16_8_ = local_b58;
  local_b48._24_8_ = local_aa0;
  local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
  local_a90._0_8_ = &boost::spirit::big_word;
  local_ad8._8_8_ = local_aa0 + 0x10;
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)&boost::spirit::eol;
  local_b28[0] = (buffer_sink *)pvVar1;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<short>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
            (&local_540);
  local_ab0._0_8_ = " unsigned_short 1";
  local_ac0._0_8_ = "SCALARS ";
  local_b68[0] = local_ac0;
  local_b68[1] = &boost::spirit::standard::string;
  local_b48._0_8_ = local_b68;
  local_b48._8_8_ = local_ab0;
  local_b58._0_8_ = local_b48;
  local_b58._8_8_ = &boost::spirit::eol;
  local_aa0._0_8_ = "LOOKUP_TABLE ";
  local_b48._16_8_ = local_b58;
  local_b48._24_8_ = local_aa0;
  local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
  local_a90._0_8_ = &boost::spirit::big_word;
  local_ad8._8_8_ = local_aa0 + 0x10;
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)&boost::spirit::eol;
  local_b28[0] = (buffer_sink *)pvVar1;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<unsigned_short>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
            (&local_4f8);
  local_ac0._0_8_ = "SCALARS ";
  local_b68[1] = &boost::spirit::standard::string;
  local_ab0._0_8_ = " int 1";
  local_b48._0_8_ = local_b68;
  local_b48._8_8_ = local_ab0;
  local_b58._0_8_ = local_b48;
  local_b58._8_8_ = &boost::spirit::eol;
  local_aa0._0_8_ = "LOOKUP_TABLE ";
  local_b48._24_8_ = local_aa0;
  local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
  local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
  local_a90._0_8_ = &boost::spirit::big_dword;
  local_ad8._8_8_ = local_aa0 + 0x10;
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)&boost::spirit::eol;
  local_b68[0] = local_ac0;
  local_b48._16_8_ = (pointer)local_b58;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<int>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
            (&local_4b0);
  local_ab0._0_8_ = " unsigned_int 1";
  local_ac0._0_8_ = "SCALARS ";
  local_b68[1] = &boost::spirit::standard::string;
  local_b48._0_8_ = local_b68;
  local_b48._8_8_ = local_ab0;
  local_b58._0_8_ = local_b48;
  local_b58._8_8_ = &boost::spirit::eol;
  local_aa0._0_8_ = "LOOKUP_TABLE ";
  local_b48._24_8_ = local_aa0;
  local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
  local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
  local_a90._0_8_ = &boost::spirit::big_dword;
  local_ad8._8_8_ = local_aa0 + 0x10;
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)&boost::spirit::eol;
  local_b68[0] = local_ac0;
  local_b48._16_8_ = (pointer)local_b58;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<unsigned_int>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
            ((extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<unsigned_int>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<unsigned_int>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
              *)local_468);
  local_ac0._0_8_ = "SCALARS ";
  local_b68[1] = &boost::spirit::standard::string;
  local_ab0._0_8_ = " long 1";
  local_b48._0_8_ = local_b68;
  local_b48._8_8_ = local_ab0;
  local_b58._0_8_ = local_b48;
  local_b58._8_8_ = &boost::spirit::eol;
  local_aa0._0_8_ = "LOOKUP_TABLE ";
  local_b48._24_8_ = local_aa0;
  pvVar1 = (pointer)(local_b48 + 0x10);
  local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
  local_a90._0_8_ = &boost::spirit::big_qword;
  local_ad8._8_8_ = local_aa0 + 0x10;
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)&boost::spirit::eol;
  local_b68[0] = local_ac0;
  local_b48._16_8_ = (pointer)local_b58;
  local_b28[0] = (buffer_sink *)pvVar1;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<long>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
            ((extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<long>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile::ScalarData<long>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
              *)local_420);
  local_ab0._0_8_ = " unsigned_long 1";
  local_ac0._0_8_ = "SCALARS ";
  local_b68[0] = local_ac0;
  local_b68[1] = &boost::spirit::standard::string;
  local_b48._0_8_ = local_b68;
  local_b48._8_8_ = local_ab0;
  local_b58._0_8_ = local_b48;
  local_b58._8_8_ = &boost::spirit::eol;
  local_aa0._0_8_ = "LOOKUP_TABLE ";
  local_b48._24_8_ = local_aa0;
  local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
  local_a90._0_8_ = &boost::spirit::big_qword;
  local_ad8._8_8_ = local_aa0 + 0x10;
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)&boost::spirit::eol;
  local_b48._16_8_ = (pointer)local_b58;
  local_b28[0] = (buffer_sink *)pvVar1;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<unsigned_long>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
            (local_3d8);
  local_ac0._0_8_ = "SCALARS ";
  local_b68[0] = local_ac0;
  local_b68[1] = &boost::spirit::standard::string;
  local_ab0._0_8_ = " float 1";
  local_b48._0_8_ = local_b68;
  local_b48._8_8_ = local_ab0;
  local_b58._0_8_ = local_b48;
  local_b58._8_8_ = &boost::spirit::eol;
  local_aa0._0_8_ = "LOOKUP_TABLE ";
  local_b48._24_8_ = local_aa0;
  local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
  local_a90._0_8_ = &boost::spirit::big_bin_float;
  local_ad8._8_8_ = local_aa0 + 0x10;
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)&boost::spirit::eol;
  local_b48._16_8_ = (pointer)local_b58;
  local_b28[0] = (buffer_sink *)pvVar1;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<float>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
            (&local_390);
  local_ac0._0_8_ = "SCALARS ";
  local_ab0._0_8_ = " double 1";
  local_aa0._0_8_ = "LOOKUP_TABLE ";
  local_b68[0] = local_ac0;
  local_b68[1] = &boost::spirit::standard::string;
  local_b48._0_8_ = local_b68;
  local_b48._8_8_ = local_ab0;
  local_b58._0_8_ = local_b48;
  local_b58._8_8_ = &boost::spirit::eol;
  local_b48._24_8_ = local_aa0;
  local_b28[1] = (buffer_sink *)&boost::spirit::standard::string;
  local_a90._0_8_ = &boost::spirit::big_bin_double;
  local_ad8._8_8_ = local_aa0 + 0x10;
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)&boost::spirit::eol;
  local_b48._16_8_ = (pointer)local_b58;
  local_b28[0] = (buffer_sink *)pvVar1;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::ScalarData<double>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::termi___t::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
            (&local_348);
  local_b58._0_8_ = "VECTORS ";
  local_b48._24_8_ = &boost::spirit::standard::string;
  local_b48._0_8_ = " float";
  local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
  local_b28[1] = (buffer_sink *)local_b48;
  local_ac0._0_8_ = &boost::spirit::big_bin_float;
  local_ac0._8_8_ = &boost::spirit::big_bin_float;
  local_b68[0] = local_ac0;
  local_b68[1] = &boost::spirit::big_bin_float;
  local_ab0._0_8_ = local_b68;
  local_ad8._8_8_ = local_ab0;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)&boost::spirit::eol;
  local_b48._16_8_ = (pointer)local_b58;
  _local_b18 = (buffer_sink *)local_ad8;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::VectorData<float>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[7]>>>,0l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::big_bin_float>const&,boost::spirit::terminal<boost::spirit::tag::big_bin_float>const&>,2l>const&,boost::spirit::terminal<boost::spirit::tag::big_bin_float>const&>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
            (&local_300);
  local_b58._0_8_ = "VECTORS ";
  local_b48._24_8_ = &boost::spirit::standard::string;
  local_b48._0_8_ = (long)"long double" + 4;
  local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
  local_b28[1] = (buffer_sink *)local_b48;
  local_ac0._0_8_ = &boost::spirit::big_bin_double;
  local_ac0._8_8_ = &boost::spirit::big_bin_double;
  local_b68[0] = local_ac0;
  local_b68[1] = &boost::spirit::big_bin_double;
  local_ab0._0_8_ = local_b68;
  local_ad8._8_8_ = local_ab0;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)&boost::spirit::eol;
  local_b48._16_8_ = (pointer)local_b58;
  _local_b18 = (buffer_sink *)local_ad8;
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,lf::io::VtkFile::VectorData<double>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[9]>>>,0l>const&,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[8]>>>,0l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::big_bin_double>const&,boost::spirit::terminal<boost::spirit::tag::big_bin_double>const&>,2l>const&,boost::spirit::terminal<boost::spirit::tag::big_bin_double>const&>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>const&>,2l>>
            ((counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
              *)(local_2f8 + 0x40),local_b18);
  local_aa0._0_8_ = &local_5d0;
  local_aa0._8_8_ = &local_588;
  local_ab0._0_8_ = local_aa0;
  local_ab0._8_8_ = &local_540;
  local_ac0._8_8_ = &local_4f8;
  local_b68[0] = local_ac0;
  local_b68[1] = (char *)&local_4b0;
  local_b48._8_8_ = local_468;
  local_b58._0_8_ = local_b48;
  local_b58._8_8_ = local_420;
  local_b48._16_8_ = local_b58;
  local_b48._24_8_ = local_3d8;
  local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
  local_b28[1] = (buffer_sink *)&local_390;
  local_ad8._8_8_ = &local_300;
  local_b48._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_b68;
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)(local_2f8 + 0x40);
  local_ad8._0_8_ = (car_type)&stack0xfffffffffffff488;
  local_ac0._0_8_ = local_ab0;
  local_a90._0_8_ = local_b18;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,char,std::char_traits<char>>,std::vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::e___,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&>,1l>>
            ((counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
              *)local_618,local_aa0 + 0x10);
  local_240 = &local_260.prev_count;
  local_260.prev_count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0x40b2bf;
  local_a70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_240;
  local_238 = &boost::spirit::eol;
  local_a58 = &boost::spirit::standard::string;
  local_a70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_a70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> +
                0x10);
  local_a90._16_8_ = &local_a70;
  local_a90._24_8_ = &boost::spirit::stream;
  local_a90._0_8_ = local_a90 + 0x10;
  local_ab0._0_8_ = local_aa0;
  local_b68[1] = (char *)&local_260;
  local_260.count = 0x40b2da;
  local_b68[0] = local_ac0;
  local_b48._8_8_ = local_a3e;
  local_b58._0_8_ = local_b48;
  local_b48._16_8_ = local_b58;
  local_b28[1] = (buffer_sink *)local_270;
  local_270[0] = "CELL_DATA ";
  local_b28[0] = (buffer_sink *)(local_b48 + 0x10);
  local_a70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&boost::spirit::eol;
  local_a90._8_8_ = &boost::spirit::eol;
  local_ab0._8_8_ = &boost::spirit::eol;
  local_b58._8_8_ = &boost::spirit::eol;
  local_ad8._8_8_ = &boost::spirit::eol;
  local_aa0._8_8_ = &local_930;
  local_ac0._8_8_ = &local_738;
  local_b48._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_b68;
  local_b48._24_8_ =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)local_618;
  _local_b18 = (buffer_sink *)local_ad8;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)local_618;
  local_ad8._0_8_ = (VtkFile *)&stack0xfffffffffffff488;
  local_ac0._0_8_ = local_ab0;
  local_aa0._0_8_ = local_aa0 + 0x10;
  boost::spirit::karma::
  rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_8e269db2_>(&local_9c0);
  _local_b18 = (buffer_sink *)0x0;
  cStack_b10.count =
       (counting_sink<boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
        *)0x0;
  local_b08._0_7_ = 0;
  local_b08[7] = 0;
  local_b08._8_4_ = 1;
  local_b08[0xc] = 0;
  local_b08._13_2_ = 0;
  local_b08[0xf] = 0;
  local_b08._16_8_ = (pointer)0x1;
  local_b08[0x18] = true;
  local_ae8 = (pointer)&local_9f8;
  if (((reference_wrapper<const_boost::spirit::karma::rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        *)&(((function_type *)(local_9e8._0_8_ + 0x28))->
           super_function_n<bool,_boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_lf::io::VtkFile_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
           ).super_function_base.vtable)->t_ ==
      (rule<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_lf::io::VtkFile_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)0x0) {
LAB_001c6a66:
    bVar3 = false;
  }
  else {
    local_ad8._0_8_ = local_a50;
    rVar7 = boost::
            function_n<bool,_boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_lf::io::VtkFile_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
            ::operator()((function_n<bool,_boost::spirit::karma::detail::output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_lf::io::VtkFile_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                          *)(local_9e8._0_8_ + 0x28),
                         (output_iterator<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>
                          *)local_b18,
                         (context<boost::fusion::cons<const_lf::io::VtkFile_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>
                          *)local_ad8,(unused_type *)&boost::spirit::unused);
    bVar3 = true;
    if (!rVar7) goto LAB_001c6a66;
  }
  anon_unknown_1::
  VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_true>::
  ~VtkGrammar((VtkGrammar<boost::spirit::karma::ostream_iterator<char,_char,_std::char_traits<char>_>,_true>
               *)local_9e8);
LAB_001c88f4:
  std::ofstream::close();
  if (bVar3) {
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return;
  }
  puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_a38 = &local_a28;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a3e + 6),"Karma error","");
  *puVar9 = &PTR__LfException_004d4a40;
  puVar9[1] = puVar9 + 3;
  if (local_a38 == &local_a28) {
    *(uint *)(puVar9 + 3) = local_a28;
    *(undefined4 *)((long)puVar9 + 0x1c) = uStack_a24;
    *(undefined4 *)(puVar9 + 4) = uStack_a20;
    *(undefined4 *)((long)puVar9 + 0x24) = uStack_a1c;
  }
  else {
    puVar9[1] = local_a38;
    puVar9[3] = CONCAT44(uStack_a24,local_a28);
  }
  puVar9[2] = local_a30;
  local_a30 = 0;
  local_a28 = local_a28 & 0xffffff00;
  local_a38 = &local_a28;
  __cxa_throw(puVar9,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
}

Assistant:

void WriteToFile(const VtkFile& vtk_file, const std::string& filename) {
  std::ofstream file(filename, std::ios_base::out | std::ios_base::binary |
                                   std::ios_base::trunc);
  ValidateVtkFile(vtk_file);

  if (!file.is_open()) {
    throw base::LfException("Could not open file " + filename +
                            " for writing.");
  }
  karma::ostream_iterator<char> outit(file);

  bool result = false;
  if (vtk_file.format == VtkFile::Format::BINARY) {
    const VtkGrammar<decltype(outit), true> grammar{};
    result = karma::generate(outit, grammar, vtk_file);
  } else {
    const VtkGrammar<decltype(outit), false> grammar{};
    result = karma::generate(outit, grammar, vtk_file);
  }

  file.close();
  if (!result) {
    throw base::LfException("Karma error");
  }
}